

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall higan::LogFile::AppendInternal(LogFile *this,char *str,size_t len)

{
  time_t tVar1;
  pointer pFVar2;
  size_t sVar3;
  time_t now;
  size_t len_local;
  char *str_local;
  LogFile *this_local;
  
  tVar1 = time((time_t *)0x0);
  pFVar2 = std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::
           operator->(&this->file_ptr_);
  FileForAppend::Append(pFVar2,str,len);
  if (this->last_flush_time_ + 3 < tVar1) {
    Flush(this);
    this->last_flush_time_ = tVar1;
  }
  if (this->last_roll_time_ + 0x15180 < tVar1) {
    RollFile(this);
    this->last_roll_time_ = tVar1;
  }
  pFVar2 = std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::
           operator->(&this->file_ptr_);
  sVar3 = FileForAppend::GetWriteSumBytes(pFVar2);
  if (0xa00000 < sVar3) {
    RollFile(this);
  }
  return;
}

Assistant:

void LogFile::AppendInternal(const char* str, size_t len)
{
	time_t now = time(nullptr);

	file_ptr_->Append(str, len);

	if (now > last_flush_time_ + DEFAULT_FLUSH_INTERVAL)
	{
		Flush();
		last_flush_time_ = now;
	}

	if (now > last_roll_time_ + DEFAULT_ROLL_INTERVAL)
	{
		RollFile();
		last_roll_time_ = now;
	}

	if (file_ptr_->GetWriteSumBytes() > DEFAULT_MAX_FILE_SIZE)
	{
		RollFile();
	}
}